

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
          (QCommonArrayOps<QSslCertificate> *this,QSslCertificate *b,QSslCertificate *e)

{
  long lVar1;
  bool bVar2;
  QArrayDataPointer<QSslCertificate> *old_00;
  QSslCertificate *in_RDX;
  QSslCertificate *in_RSI;
  QGenericArrayOps<QSslCertificate> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QSslCertificate> *c;
  GrowthPosition where;
  QArrayDataPointer<QSslCertificate> *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    old_00 = (QArrayDataPointer<QSslCertificate> *)((long)in_RDX - (long)in_RSI >> 3);
    c = (QCommonArrayOps<QSslCertificate> *)0xaaaaaaaaaaaaaaaa;
    this_00 = (QArrayDataPointer<QSslCertificate> *)0xaaaaaaaaaaaaaaaa;
    QArrayDataPointer<QSslCertificate>::QArrayDataPointer
              ((QArrayDataPointer<QSslCertificate> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QSslCertificate>,QSslCertificate_const*>
                      ((QSslCertificate **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QSslCertificate **)in_RDX,old_00);
    }
    else {
      QArrayDataPointer<QSslCertificate>::detachAndGrow
                (this_00,where,(qsizetype)in_RDI,(QSslCertificate **)in_RDX,old_00);
    }
    QGenericArrayOps<QSslCertificate>::copyAppend(in_RDI,in_RDX,(QSslCertificate *)old_00);
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(old_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }